

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int addk(FuncState *fs,TValue *key,TValue *v)

{
  lua_State *L_00;
  Proto *o;
  int iVar1;
  TValue *pTVar2;
  TValue *io1;
  TValue *io;
  int oldsize;
  int k;
  TValue *idx;
  Proto *f;
  lua_State *L;
  TValue *v_local;
  TValue *key_local;
  FuncState *fs_local;
  
  L_00 = fs->ls->L;
  o = fs->f;
  pTVar2 = luaH_set(L_00,fs->ls->h,key);
  if ((((pTVar2->tt_ != 0x13) || (fs_local._4_4_ = (pTVar2->value_).b, fs->nk <= fs_local._4_4_)) ||
      ((o->k[fs_local._4_4_].tt_ & 0x3fU) != (v->tt_ & 0x3fU))) ||
     (iVar1 = luaV_equalobj((lua_State *)0x0,o->k + fs_local._4_4_,v), iVar1 == 0)) {
    io._0_4_ = o->sizek;
    fs_local._4_4_ = fs->nk;
    pTVar2->value_ = (Value)(long)fs_local._4_4_;
    pTVar2->tt_ = 0x13;
    if (o->sizek < fs_local._4_4_ + 1) {
      pTVar2 = (TValue *)luaM_growaux_(L_00,o->k,&o->sizek,0x10,0x3ffffff,"constants");
      o->k = pTVar2;
    }
    while ((int)io < o->sizek) {
      o->k[(int)io].tt_ = 0;
      io._0_4_ = (int)io + 1;
    }
    pTVar2 = o->k;
    pTVar2[fs_local._4_4_].value_ = v->value_;
    (&pTVar2[fs_local._4_4_].value_)[1] = *(Value *)&v->tt_;
    fs->nk = fs->nk + 1;
    if ((((v->tt_ & 0x40U) != 0) && ((o->marked & 4) != 0)) && ((((v->value_).gc)->marked & 3) != 0)
       ) {
      luaC_barrier_(L_00,(GCObject *)o,(v->value_).gc);
    }
  }
  return fs_local._4_4_;
}

Assistant:

static int addk (FuncState *fs, TValue *key, TValue *v) {
  lua_State *L = fs->ls->L;
  Proto *f = fs->f;
  TValue *idx = luaH_set(L, fs->ls->h, key);  /* index scanner table */
  int k, oldsize;
  if (ttisinteger(idx)) {  /* is there an index there? */
    k = cast_int(ivalue(idx));
    /* correct value? (warning: must distinguish floats from integers!) */
    if (k < fs->nk && ttypetag(&f->k[k]) == ttypetag(v) &&
                      luaV_rawequalobj(&f->k[k], v))
      return k;  /* reuse index */
  }
  /* constant not found; create a new entry */
  oldsize = f->sizek;
  k = fs->nk;
  /* numerical value does not need GC barrier;
     table has no metatable, so it does not need to invalidate cache */
  setivalue(idx, k);
  luaM_growvector(L, f->k, k, f->sizek, TValue, MAXARG_Ax, "constants");
  while (oldsize < f->sizek) setnilvalue(&f->k[oldsize++]);
  setobj(L, &f->k[k], v);
  fs->nk++;
  luaC_barrier(L, f, v);
  return k;
}